

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O3

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
LargeGapGrayCode::computeRunLengths
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,LargeGapGrayCode *this,int bitWidth)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  pointer piVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  pointer piVar13;
  int iVar14;
  ulong uVar15;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> transitionLastSeen;
  vector<int,_std::allocator<int>_> t;
  allocator_type local_31;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (this->m_transitionSequences).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + ((long)bitWidth - 1));
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)CONCAT44(t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,(long)bitWidth,
             (value_type_conflict1 *)
             &t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,&local_31);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar14 = 1;
  piVar5 = t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar10 = t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  ;
  piVar13 = transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  do {
    lVar8 = (long)piVar10 - (long)piVar13;
    piVar10 = piVar13;
    if (lVar8 != 0) {
      uVar9 = lVar8 >> 2;
      uVar15 = 0;
      do {
        iVar3 = piVar13[uVar15];
        iVar4 = *(int *)((long)local_70 + (long)iVar3 * 4);
        if (iVar4 == -1) {
          *(int *)((long)local_70 + (long)iVar3 * 4) = (int)uVar15;
        }
        else {
          iVar6 = (int)uVar9 * iVar14 + (int)uVar15;
          *(int *)((long)local_70 + (long)iVar3 * 4) = iVar6;
          if (iVar14 == 2) {
            uVar7 = iVar6 - iVar4;
            p_Var12 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
            p_Var11 = &p_Var1->_M_header;
            if (p_Var12 != (_Base_ptr)0x0) {
              do {
                if ((int)uVar7 <= (int)*(size_t *)(p_Var12 + 1)) {
                  p_Var11 = p_Var12;
                }
                p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < (int)uVar7];
              } while (p_Var12 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
                 ((int)((_Rb_tree_header *)p_Var11)->_M_node_count <= (int)uVar7)) {
                puVar2 = (undefined1 *)((long)&((_Rb_tree_header *)p_Var11)->_M_node_count + 4);
                *(int *)puVar2 = *(int *)puVar2 + 1;
                goto LAB_00104a80;
              }
            }
            t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)((ulong)uVar7 | 0x100000000);
            std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
            ::_M_emplace_unique<std::pair<int,int>>
                      ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                        *)__return_storage_ptr__,
                       (pair<int,_int> *)
                       &t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            piVar5 = t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_start;
            piVar13 = transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
        }
LAB_00104a80:
        uVar15 = uVar15 + 1;
        uVar9 = (long)piVar5 - (long)piVar13 >> 2;
        piVar10 = piVar5;
      } while (uVar15 < uVar9);
    }
    iVar14 = iVar14 + 1;
    if (iVar14 == 3) {
      if (local_70 != (undefined1  [8])0x0) {
        operator_delete((void *)local_70);
        piVar13 = transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      if (piVar13 != (pointer)0x0) {
        operator_delete(piVar13);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::map<int, int> LargeGapGrayCode::computeRunLengths(int bitWidth)
{
	std::vector<int> t = m_transitionSequences[bitWidth-1];
	std::vector<int> transitionLastSeen(bitWidth, -1);

	std::map<int, int> numRunLengths;

	for(int runThrough = 1; runThrough <= 2; ++runThrough) {
		for(int i = 0; i < t.size(); ++i) {
			if(transitionLastSeen[t[i]] == -1) {
				transitionLastSeen[t[i]] = i;
			}
			else {
				int runLength = runThrough*t.size()+i-transitionLastSeen[t[i]];
				transitionLastSeen[t[i]] = runThrough*t.size()+i;

				if(runThrough == 2) {
					std::map<int, int>::iterator it = numRunLengths.find(runLength);
					if (it != numRunLengths.end()) {
					    it->second += 1;
					}
					else {
						numRunLengths.insert(std::make_pair(runLength, 1));
					}
				}
			}
		}
	}

	return numRunLengths;
}